

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O2

void duckdb::FillScanErrorTable
               (InternalAppender *scan_appender,idx_t scan_idx,idx_t file_idx,CSVFileScan *file)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this;
  bool bVar1;
  uint value;
  ostream *poVar2;
  const_reference pvVar3;
  const_reference this_00;
  mapped_type *pmVar4;
  idx_t i;
  ulong __n;
  anon_union_16_2_67f50693_for_value local_4d0;
  anon_union_16_2_67f50693_for_value local_4c0;
  anon_union_16_2_67f50693_for_value local_4b0;
  anon_union_16_2_67f50693_for_value local_4a0;
  anon_union_16_2_67f50693_for_value local_490;
  anon_union_16_2_67f50693_for_value local_480;
  anon_union_16_2_67f50693_for_value local_470;
  anon_union_16_2_67f50693_for_value local_460;
  LogicalType local_450;
  LogicalType local_438;
  LogicalType local_420;
  string parameters;
  StrpTimeFormat date_format;
  Value local_370;
  Value local_330;
  Value local_2f0;
  anon_union_16_2_67f50693_for_value local_2b0;
  ostringstream columns;
  Value local_128;
  Value local_e8;
  StrpTimeFormat timestamp_format;
  
  BaseAppender::BeginRow(&scan_appender->super_BaseAppender);
  BaseAppender::Append<unsigned_long>(&scan_appender->super_BaseAppender,scan_idx);
  BaseAppender::Append<unsigned_long>(&scan_appender->super_BaseAppender,file_idx);
  string_t::string_t((string_t *)&local_2b0.pointer,&(file->super_BaseFileReader).file.path);
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_2b0);
  ::std::__cxx11::string::string
            ((string *)&columns,
             (string *)&(file->options).dialect_options.state_machine_options.delimiter.value);
  string_t::string_t((string_t *)&local_460.pointer,(string *)&columns);
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_460);
  ::std::__cxx11::string::~string((string *)&columns);
  CSVOption<char>::FormatValue_abi_cxx11_
            ((string *)&columns,&(file->options).dialect_options.state_machine_options.quote);
  string_t::string_t((string_t *)&local_470.pointer,(string *)&columns);
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_470);
  ::std::__cxx11::string::~string((string *)&columns);
  CSVOption<char>::FormatValue_abi_cxx11_
            ((string *)&columns,&(file->options).dialect_options.state_machine_options.escape);
  string_t::string_t((string_t *)&local_480.pointer,(string *)&columns);
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_480);
  ::std::__cxx11::string::~string((string *)&columns);
  CSVReaderOptions::NewLineIdentifierToString_abi_cxx11_((string *)&columns,&file->options);
  string_t::string_t((string_t *)&local_490.pointer,(string *)&columns);
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_490);
  ::std::__cxx11::string::~string((string *)&columns);
  value = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    ((file->options).dialect_options.skip_rows.value);
  Value::UINTEGER(&local_e8,value);
  BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_e8);
  Value::~Value(&local_e8);
  Value::BOOLEAN(&local_128,(file->options).dialect_options.header.value);
  BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_128);
  Value::~Value(&local_128);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&columns);
  ::std::operator<<((ostream *)&columns,"{");
  for (__n = 0; __n < (ulong)(((long)(file->types).
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(file->types).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    poVar2 = ::std::operator<<((ostream *)&columns,"\'");
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&file->names,__n);
    poVar2 = ::std::operator<<(poVar2,(string *)pvVar3);
    poVar2 = ::std::operator<<(poVar2,"\': \'");
    this_00 = vector<duckdb::LogicalType,_true>::get<true>(&file->types,__n);
    LogicalType::ToString_abi_cxx11_((string *)&date_format,this_00);
    poVar2 = ::std::operator<<(poVar2,(string *)&date_format);
    ::std::operator<<(poVar2,"\'");
    ::std::__cxx11::string::~string((string *)&date_format);
    if (__n != ((long)(file->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(file->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U) {
      ::std::operator<<((ostream *)&columns,",");
    }
  }
  ::std::operator<<((ostream *)&columns,"}");
  ::std::__cxx11::stringbuf::str();
  string_t::string_t((string_t *)&local_4a0.pointer,(string *)&date_format);
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_4a0);
  ::std::__cxx11::string::~string((string *)&date_format);
  this = &(file->options).dialect_options.date_format;
  pmVar4 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::operator[](this,&LogicalType::DATE);
  StrpTimeFormat::StrpTimeFormat(&date_format,&pmVar4->value);
  bVar1 = StrTimeFormat::Empty(&date_format.super_StrTimeFormat);
  if (bVar1) {
    LogicalType::LogicalType(&local_420,SQLNULL);
    Value::Value(&local_2f0,&local_420);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_2f0);
    Value::~Value(&local_2f0);
    LogicalType::~LogicalType(&local_420);
  }
  else {
    string_t::string_t((string_t *)&local_4b0.pointer,
                       &date_format.super_StrTimeFormat.format_specifier);
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_4b0);
  }
  pmVar4 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::operator[](this,&LogicalType::TIMESTAMP);
  StrpTimeFormat::StrpTimeFormat(&timestamp_format,&pmVar4->value);
  bVar1 = StrTimeFormat::Empty(&timestamp_format.super_StrTimeFormat);
  if (bVar1) {
    LogicalType::LogicalType(&local_438,SQLNULL);
    Value::Value(&local_330,&local_438);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_330);
    Value::~Value(&local_330);
    LogicalType::~LogicalType(&local_438);
  }
  else {
    string_t::string_t((string_t *)&local_4c0.pointer,
                       &timestamp_format.super_StrTimeFormat.format_specifier);
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_4c0);
  }
  if ((file->options).user_defined_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  {
    LogicalType::LogicalType(&local_450,SQLNULL);
    Value::Value(&local_370,&local_450);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_370);
    Value::~Value(&local_370);
    LogicalType::~LogicalType(&local_450);
  }
  else {
    CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_(&parameters,&file->options);
    string_t::string_t((string_t *)&local_4d0.pointer,&parameters);
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,(string_t)local_4d0);
    ::std::__cxx11::string::~string((string *)&parameters);
  }
  BaseAppender::EndRow(&scan_appender->super_BaseAppender);
  StrTimeFormat::~StrTimeFormat(&timestamp_format.super_StrTimeFormat);
  StrTimeFormat::~StrTimeFormat(&date_format.super_StrTimeFormat);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&columns);
  return;
}

Assistant:

void FillScanErrorTable(InternalAppender &scan_appender, idx_t scan_idx, idx_t file_idx, CSVFileScan &file) {
	CSVReaderOptions &options = file.options;
	// Add the row to the rejects table
	scan_appender.BeginRow();
	// 1. Scan Idx
	scan_appender.Append(scan_idx);
	// 2. File Idx
	scan_appender.Append(file_idx);
	// 3. File Path
	scan_appender.Append(string_t(file.GetFileName()));
	// 4. Delimiter
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.delimiter.FormatValue()));
	// 5. Quote
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.quote.FormatValue()));
	// 6. Escape
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.escape.FormatValue()));
	// 7. NewLine Delimiter
	scan_appender.Append(string_t(options.NewLineIdentifierToString()));
	// 8. Skip Rows
	scan_appender.Append(Value::UINTEGER(NumericCast<uint32_t>(options.dialect_options.skip_rows.GetValue())));
	// 9. Has Header
	scan_appender.Append(Value::BOOLEAN(options.dialect_options.header.GetValue()));

	auto &types = file.GetTypes();
	auto &names = file.GetNames();

	// 10. List<Struct<Column-Name:Types>> {'col1': 'INTEGER', 'col2': 'VARCHAR'}
	std::ostringstream columns;
	columns << "{";
	for (idx_t i = 0; i < types.size(); i++) {
		columns << "'" << names[i] << "': '" << types[i].ToString() << "'";
		if (i != types.size() - 1) {
			columns << ",";
		}
	}
	columns << "}";
	scan_appender.Append(string_t(columns.str()));
	// 11. Date Format
	auto date_format = options.dialect_options.date_format[LogicalType::DATE].GetValue();
	if (!date_format.Empty()) {
		scan_appender.Append(string_t(date_format.format_specifier));
	} else {
		scan_appender.Append(Value());
	}

	// 12. Timestamp Format
	auto timestamp_format = options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue();
	if (!timestamp_format.Empty()) {
		scan_appender.Append(string_t(timestamp_format.format_specifier));
	} else {
		scan_appender.Append(Value());
	}

	// 13. The Extra User Arguments
	if (options.user_defined_parameters.empty()) {
		scan_appender.Append(Value());
	} else {
		auto parameters = options.GetUserDefinedParameters();
		scan_appender.Append(string_t(parameters));
	}
	// Finish the row to the rejects table
	scan_appender.EndRow();
}